

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.cpp
# Opt level: O3

bool nullcInitDynamicModule(Linker *linker)

{
  nullres nVar1;
  bool bVar2;
  
  bVar2 = false;
  NULLCDynamic::linker = linker;
  nVar1 = nullcBindModuleFunctionWrapper
                    ("std.dynamic",NULLCDynamic::OverrideFunction,
                     nullcWrapCall2<void,NULLCRef,NULLCRef>,"override",0);
  if (nVar1 != '\0') {
    nVar1 = nullcBindModuleFunctionWrapper
                      ("std.dynamic",NULLCDynamic::Override,nullcWrapCall2<void,NULLCRef,NULLCArray>
                       ,"override",1);
    bVar2 = nVar1 != '\0';
  }
  return bVar2;
}

Assistant:

bool	nullcInitDynamicModule(Linker* linker)
{
	NULLCDynamic::linker = linker;

	REGISTER_FUNC(OverrideFunction, "override", 0);
	REGISTER_FUNC(Override, "override", 1);

	return true;
}